

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LA32WaveGenerator.cpp
# Opt level: O1

Bit32u __thiscall
MT32Emu::LA32WaveGenerator::getHighLinearLength(LA32WaveGenerator *this,Bit32u effectiveCutoffValue)

{
  Bit16u BVar1;
  Bit32u BVar2;
  uint uVar3;
  uint uVar4;
  
  uVar3 = (uint)this->pulseWidth * 0x40 - 0x2000;
  BVar2 = 0;
  if (this->pulseWidth < 0x81) {
    uVar3 = 0;
  }
  uVar4 = effectiveCutoffValue - uVar3;
  if (uVar3 <= effectiveCutoffValue && uVar4 != 0) {
    BVar1 = LA32Utilites::interpolateExp(~(ushort)uVar4 & 0xfff);
    BVar2 = ((uint)BVar1 << ((char)(uVar4 >> 0xc) + 7U & 0x1f)) - 0x80000;
  }
  return BVar2;
}

Assistant:

Bit32u LA32WaveGenerator::getHighLinearLength(Bit32u effectiveCutoffValue) {
	// Ratio of positive segment to wave length
	Bit32u effectivePulseWidthValue = 0;
	if (pulseWidth > 128) {
		effectivePulseWidthValue = (pulseWidth - 128) << 6;
	}

	Bit32u highLinearLength = 0;
	// highLinearLength = EXP2F(19.0f - effectivePulseWidthValue / 4096.0f + effectiveCutoffValue / 4096.0f) - 2 * SINE_SEGMENT_RELATIVE_LENGTH;
	if (effectivePulseWidthValue < effectiveCutoffValue) {
		Bit32u expArg = effectiveCutoffValue - effectivePulseWidthValue;
		highLinearLength = LA32Utilites::interpolateExp(~expArg & 4095);
		highLinearLength <<= 7 + (expArg >> 12);
		highLinearLength -= 2 * SINE_SEGMENT_RELATIVE_LENGTH;
	}
	return highLinearLength;
}